

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2shape_index_region.h
# Opt level: O2

void __thiscall
S2ShapeIndexRegion<MutableS2ShapeIndex>::S2ShapeIndexRegion
          (S2ShapeIndexRegion<MutableS2ShapeIndex> *this,MutableS2ShapeIndex *index)

{
  Options local_c;
  
  (this->super_S2Region)._vptr_S2Region = (_func_int **)&PTR__S2ShapeIndexRegion_00305c60;
  local_c.vertex_model_ = SEMI_OPEN;
  S2ContainsPointQuery<MutableS2ShapeIndex>::S2ContainsPointQuery
            (&this->contains_query_,index,&local_c);
  this->iter_ = &(this->contains_query_).it_;
  return;
}

Assistant:

S2ShapeIndexRegion<IndexType>::S2ShapeIndexRegion(const IndexType* index)
    : contains_query_(index) {
}